

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  ulong uVar1;
  U32 maxDist_00;
  U32 UVar2;
  U32 reducerValue;
  uint uVar3;
  void *pvVar4;
  void *src_00;
  BYTE *srcSize_00;
  BYTE *code;
  bool bVar5;
  void *local_d8;
  U32 correction;
  U32 ldmHSize;
  size_t prevSize;
  size_t newLeftoverSize;
  size_t chunkSize;
  BYTE *chunkEnd;
  size_t remaining;
  BYTE *chunkStart;
  size_t leftoverSize;
  size_t chunk;
  size_t nbChunks;
  size_t kMaxChunkSize;
  BYTE *iend;
  BYTE *istart;
  U32 maxDist;
  size_t srcSize_local;
  void *src_local;
  ldmParams_t *params_local;
  rawSeqStore_t *sequences_local;
  ldmState_t *ldmState_local;
  
  maxDist_00 = 1 << ((byte)params->windowLog & 0x1f);
  pvVar4 = (void *)((long)src + srcSize);
  chunkStart = (BYTE *)0x0;
  if ((ldmState->window).nextSrc < (BYTE *)((long)src + srcSize)) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44ee,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->pos <= sequences->size) {
    if (sequences->capacity < sequences->size) {
      __assert_fail("sequences->size <= sequences->capacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x44f3,
                    "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                   );
    }
    leftoverSize = 0;
    while( true ) {
      bVar5 = false;
      if (leftoverSize < (srcSize >> 0x14) + (ulong)((srcSize & 0xfffff) != 0)) {
        bVar5 = sequences->size < sequences->capacity;
      }
      if (!bVar5) {
        return 0;
      }
      src_00 = (void *)((long)src + leftoverSize * 0x100000);
      local_d8 = pvVar4;
      if (0xfffff < (ulong)((long)pvVar4 - (long)src_00)) {
        local_d8 = (void *)((long)src_00 + 0x100000);
      }
      srcSize_00 = (BYTE *)((long)local_d8 - (long)src_00);
      uVar1 = sequences->size;
      if (pvVar4 <= src_00) break;
      UVar2 = ZSTD_window_needOverflowCorrection(ldmState->window,local_d8);
      if (UVar2 != 0) {
        UVar2 = params->hashLog;
        reducerValue = ZSTD_window_correctOverflow(&ldmState->window,0,maxDist_00,src_00);
        ZSTD_ldm_reduceTable(ldmState->hashTable,1 << ((byte)UVar2 & 0x1f),reducerValue);
      }
      ZSTD_window_enforceMaxDist
                (&ldmState->window,local_d8,maxDist_00,&ldmState->loadedDictEnd,
                 (ZSTD_matchState_t **)0x0);
      code = (BYTE *)ZSTD_ldm_generateSequences_internal
                               (ldmState,sequences,params,src_00,(size_t)srcSize_00);
      uVar3 = ZSTD_isError((size_t)code);
      if (uVar3 != 0) {
        return (size_t)code;
      }
      if (uVar1 < sequences->size) {
        sequences->seq[uVar1].litLength = (int)chunkStart + sequences->seq[uVar1].litLength;
        chunkStart = code;
      }
      else {
        if (code != srcSize_00) {
          __assert_fail("newLeftoverSize == chunkSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x451c,
                        "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                       );
        }
        chunkStart = chunkStart + (long)srcSize_00;
      }
      leftoverSize = leftoverSize + 1;
    }
    __assert_fail("chunkStart < iend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44fd,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  __assert_fail("sequences->pos <= sequences->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x44f2,
                "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}